

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutScript.cpp
# Opt level: O1

void __thiscall NutScript::LoadFromFile(NutScript *this,char *fileName)

{
  Error *this_00;
  ifstream file;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)fileName);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    LoadFromStream(this,(istream *)local_220);
    std::ifstream::close();
    std::ifstream::~ifstream(local_220);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,"Unable to open file: \"%s\"",fileName);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void NutScript::LoadFromFile( const char* fileName )
{
	std::ifstream file;

	file.open(fileName, std::ios_base::binary | std::ios_base::in);
	if (file.fail())
		throw Error("Unable to open file: \"%s\"", fileName);

	try
	{
		LoadFromStream(file);
	}
	catch(...)
	{
		file.close();
		throw;
	}

	file.close();
}